

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O3

void __thiscall
directed_flag_complex_t::do_for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
          (directed_flag_complex_t *this,add_cell_index_to_cache_t *f,int min_dimension,
          int max_dimension,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *possible_next_vertices,
          vertex_index_t *prefix,unsigned_short prefix_size)

{
  ushort uVar1;
  ushort *puVar2;
  long lVar3;
  byte bVar4;
  filtered_directed_graph_t *pfVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  ulong uVar7;
  unsigned_long uVar8;
  ushort *puVar9;
  unsigned_short v;
  vector<unsigned_short,_std::allocator<unsigned_short>_> new_possible_vertices;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range4;
  ushort local_92;
  directed_flag_complex_t *local_90;
  void *local_88;
  iterator iStack_80;
  unsigned_short *local_78;
  uint local_70;
  int local_6c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_68;
  add_cell_index_to_cache_t *local_60;
  undefined8 local_58;
  ulong local_50;
  vertex_index_t *local_48;
  ushort *local_40;
  ushort *local_38;
  
  local_58 = CONCAT44(in_register_0000000c,max_dimension);
  uVar6 = (ulong)prefix_size;
  local_90 = this;
  local_6c = min_dimension;
  local_68 = possible_next_vertices;
  local_60 = f;
  if (min_dimension < (int)(uint)prefix_size) {
    directed_flag_complex_computer::add_cell_index_to_cache_t::operator()
              (f,prefix,(uint)prefix_size);
  }
  if ((int)local_58 + 1U != (uint)prefix_size) {
    local_38 = (local_68->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_start;
    local_40 = (local_68->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    if (local_38 != local_40) {
      local_70 = prefix_size + 1 & 0xffff;
      local_50 = uVar6;
      local_48 = prefix;
      do {
        uVar1 = *local_38;
        prefix[uVar6] = uVar1;
        local_88 = (void *)0x0;
        iStack_80._M_current = (unsigned_short *)0x0;
        local_78 = (unsigned_short *)0x0;
        if (prefix_size == 0) {
          pfVar5 = local_90->graph;
          uVar6 = (pfVar5->super_directed_graph_t).incidence_row_length;
          if (uVar6 != 0) {
            uVar7 = 0;
            do {
              uVar8 = (pfVar5->super_directed_graph_t).incidence_outgoing.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6 * uVar1 + uVar7];
              if (uVar8 != 0) {
                do {
                  lVar3 = 0;
                  if (uVar8 != 0) {
                    for (; (uVar8 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                    }
                  }
                  local_92 = (ushort)lVar3 | (ushort)(uVar7 << 6);
                  if (iStack_80._M_current == local_78) {
                    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                    _M_realloc_insert<unsigned_short>
                              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_88,
                               iStack_80,&local_92);
                  }
                  else {
                    *iStack_80._M_current = local_92;
                    iStack_80._M_current = iStack_80._M_current + 1;
                  }
                  bVar4 = (byte)lVar3 & 0x3f;
                  uVar8 = uVar8 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
                } while (uVar8 != 0);
                pfVar5 = local_90->graph;
              }
              uVar7 = uVar7 + 1;
              uVar6 = (pfVar5->super_directed_graph_t).incidence_row_length;
            } while (uVar7 < uVar6);
          }
        }
        else {
          puVar2 = (local_68->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          for (puVar9 = (local_68->
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                        .super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
            local_92 = *puVar9;
            if ((uVar1 != local_92) &&
               (((local_90->graph->super_directed_graph_t).incidence_outgoing.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(local_90->graph->super_directed_graph_t).incidence_row_length * (ulong)uVar1 +
                  (ulong)(local_92 >> 6)] >> ((ulong)local_92 & 0x3f) & 1) != 0)) {
              if (iStack_80._M_current == local_78) {
                std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_88,
                           iStack_80,&local_92);
              }
              else {
                *iStack_80._M_current = local_92;
                iStack_80._M_current = iStack_80._M_current + 1;
              }
            }
          }
        }
        prefix = local_48;
        do_for_each_cell<directed_flag_complex_computer::add_cell_index_to_cache_t>
                  (local_90,local_60,local_6c,(int)local_58,
                   (vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_88,local_48,
                   (unsigned_short)local_70);
        puVar9 = local_38;
        uVar6 = local_50;
        if (local_88 != (void *)0x0) {
          operator_delete(local_88,(long)local_78 - (long)local_88);
        }
        local_38 = puVar9 + 1;
      } while (local_38 != local_40);
    }
  }
  return;
}

Assistant:

void do_for_each_cell(Func& f, int min_dimension, int max_dimension,
	                      const std::vector<vertex_index_t>& possible_next_vertices, vertex_index_t* prefix,
	                      unsigned short prefix_size = 0) {
		// As soon as we have the correct dimension, execute f
		if (prefix_size >= min_dimension + 1) { f(prefix, prefix_size); }

		// If this is the last dimension we are interested in, exit this branch
		if (prefix_size == max_dimension + 1) return;

		for (auto vertex : possible_next_vertices) {
			// We can write the cell given by taking the current vertex as the maximal element
			prefix[prefix_size] = vertex;

			// And compute the next elements
			std::vector<vertex_index_t> new_possible_vertices;
			if (prefix_size > 0) {
				for (auto v : possible_next_vertices) {
					if (vertex != v && graph.is_connected_by_an_edge(vertex, v)) new_possible_vertices.push_back(v);
				}
			} else {
				// Get outgoing vertices of v in chunks of 64
				for (size_t offset = 0; offset < graph.incidence_row_length; offset++) {
					size_t bits = graph.get_outgoing_chunk(vertex, offset);

					size_t vertex_offset = offset << 6;
					while (bits > 0) {
						// Get the least significant non-zero bit
						auto b = __builtin_ctzl(bits);

						// Unset this bit
						bits &= ~(ONE_ << b);

						new_possible_vertices.push_back(vertex_index_t(vertex_offset + b));
					}
				}
			}

			do_for_each_cell(f, min_dimension, max_dimension, new_possible_vertices, prefix, prefix_size + 1);
		}
	}